

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O2

PyObject * libxml_doc(PyObject *self,PyObject *args)

{
  int iVar1;
  long lVar2;
  PyObject *pPVar3;
  xmlDocPtr doc;
  PyObject *obj;
  undefined *local_10;
  
  pPVar3 = (PyObject *)0x0;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"O:doc",&local_10);
  if (iVar1 != 0) {
    if (local_10 == &_Py_NoneStruct) {
      lVar2 = 0;
    }
    else {
      lVar2 = *(long *)(local_10 + 0x10);
    }
    if ((*(uint *)(lVar2 + 8) < 0x16) && ((0x242200U >> (*(uint *)(lVar2 + 8) & 0x1f) & 1) != 0)) {
      doc = (xmlDocPtr)0x0;
    }
    else {
      doc = *(xmlDocPtr *)(lVar2 + 0x40);
    }
    pPVar3 = libxml_xmlDocPtrWrap(doc);
  }
  return pPVar3;
}

Assistant:

static PyObject *
libxml_doc(ATTRIBUTE_UNUSED PyObject * self, PyObject * args)
{
    PyObject *resultobj, *obj;
    xmlNodePtr cur;
    xmlDocPtr res;

    if (!PyArg_ParseTuple(args, (char *) "O:doc", &obj))
        return NULL;
    cur = PyxmlNode_Get(obj);

#ifdef DEBUG
    printf("libxml_doc: cur = %p\n", cur);
#endif

    switch (cur->type) {
        case XML_DOCUMENT_NODE:
#ifdef LIBXML_DOCB_ENABLED
        case XML_DOCB_DOCUMENT_NODE:
#endif
        case XML_HTML_DOCUMENT_NODE:
            res = NULL;
            break;
        case XML_ATTRIBUTE_NODE:{
                xmlAttrPtr attr = (xmlAttrPtr) cur;

                res = attr->doc;
                break;
            }
        case XML_NAMESPACE_DECL:
            res = NULL;
            break;
        default:
            res = cur->doc;
            break;
    }
    resultobj = libxml_xmlDocPtrWrap(res);
    return resultobj;
}